

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O2

NativePath * __thiscall
QTemporaryFileName::generateNext(NativePath *__return_storage_ptr__,QTemporaryFileName *this)

{
  char *pcVar1;
  QRandomGenerator *this_00;
  long in_FS_OFFSET;
  quint32 rnd;
  Char *rIter;
  anon_class_16_2_d9465bab local_58;
  quint32 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = QByteArray::data(&this->path);
  pcVar1 = pcVar1 + this->pos;
  local_40 = pcVar1 + this->length;
  if (this->length != 0) {
    this_00 = &QRandomGenerator64::global()->super_QRandomGenerator;
    do {
      local_44 = QRandomGenerator::generate(this_00);
      local_58.rnd = &local_44;
      local_58.rIter = &local_40;
      generateNext::anon_class_16_2_d9465bab::operator()(&local_58);
      if (local_40 == pcVar1) break;
      generateNext::anon_class_16_2_d9465bab::operator()(&local_58);
      if (local_40 == pcVar1) break;
      generateNext::anon_class_16_2_d9465bab::operator()(&local_58);
    } while (local_40 != pcVar1);
  }
  QArrayDataPointer<char>::QArrayDataPointer
            (&__return_storage_ptr__->d,(QArrayDataPointer<char> *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QFileSystemEntry::NativePath QTemporaryFileName::generateNext()
{
    Q_ASSERT(length != 0);
    Q_ASSERT(pos < path.size());
    Q_ASSERT(length <= path.size() - pos);

    Char *const placeholderStart = (Char *)path.data() + pos;
    Char *const placeholderEnd = placeholderStart + length;

    // Replace placeholder with random chars.
    {
        // Since our dictionary is 26+26 characters, it would seem we only need
        // a random number from 0 to 63 to select a character. However, due to
        // the limited range, that would mean 12 (64-52) characters have double
        // the probability of the others: 1 in 32 instead of 1 in 64.
        //
        // To overcome this limitation, we use more bits per character. With 10
        // bits, there are 16 characters with probability 19/1024 and the rest
        // at 20/1024 (i.e, less than .1% difference). This allows us to do 3
        // characters per 32-bit random number, which is also half the typical
        // placeholder length.
        enum { BitsPerCharacter = 10 };

        Char *rIter = placeholderEnd;
        while (rIter != placeholderStart) {
            quint32 rnd = QRandomGenerator::global()->generate();
            auto applyOne = [&]() {
                quint32 v = rnd & ((1 << BitsPerCharacter) - 1);
                rnd >>= BitsPerCharacter;
                char ch = char((26 + 26) * v / (1 << BitsPerCharacter));
                if (ch < 26)
                    *--rIter = Latin1Char(ch + 'A');
                else
                    *--rIter = Latin1Char(ch - 26 + 'a');
            };

            applyOne();
            if (rIter == placeholderStart)
                break;

            applyOne();
            if (rIter == placeholderStart)
                break;

            applyOne();
        }
    }

    return path;
}